

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

void __thiscall
vkt::api::anon_unknown_1::EnvClone::EnvClone
          (EnvClone *this,Environment *parent,Parameters *deviceParams,deUint32 maxResourceConsumers
          )

{
  deUint32 dVar1;
  PlatformInterface *pPVar2;
  BinaryCollection *pBVar3;
  VkAllocationCallbacks *pVVar4;
  VkDevice_s *pVVar5;
  DestroyDeviceFunc p_Var6;
  undefined4 in_register_0000000c;
  Parameters *pPVar7;
  RefBase<vk::VkDevice_s_*> local_58;
  VkDevice_s *local_38;
  DestroyDeviceFunc p_Stack_30;
  VkAllocationCallbacks *local_28;
  
  pPVar7 = (Parameters *)CONCAT44(in_register_0000000c,maxResourceConsumers);
  Device::Resources::Resources(&this->deviceRes,parent,deviceParams);
  Device::create((Move<vk::VkDevice_s_*> *)&local_58,parent,&this->deviceRes,pPVar7);
  pVVar4 = local_58.m_data.deleter.m_allocator;
  p_Var6 = local_58.m_data.deleter.m_destroyDevice;
  pVVar5 = local_58.m_data.object;
  local_28 = local_58.m_data.deleter.m_allocator;
  local_38 = local_58.m_data.object;
  p_Stack_30 = local_58.m_data.deleter.m_destroyDevice;
  local_58.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_58.m_data.object = (VkDevice_s *)0x0;
  local_58.m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)0x0;
  (this->device).super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator = pVVar4;
  (this->device).super_RefBase<vk::VkDevice_s_*>.m_data.object = pVVar5;
  (this->device).super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice = p_Var6;
  ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_58);
  ::vk::DeviceDriver::DeviceDriver
            (&this->vkd,&(this->deviceRes).vki.super_InstanceInterface,
             (this->device).super_RefBase<vk::VkDevice_s_*>.m_data.object);
  pPVar2 = parent->vkp;
  dVar1 = (this->deviceRes).queueFamilyIndex;
  (this->env).device = (this->device).super_RefBase<vk::VkDevice_s_*>.m_data.object;
  (this->env).queueFamilyIndex = dVar1;
  pBVar3 = parent->programBinaries;
  pVVar4 = parent->allocationCallbacks;
  (this->env).vkp = pPVar2;
  (this->env).vkd = &(this->vkd).super_DeviceInterface;
  (this->env).programBinaries = pBVar3;
  (this->env).allocationCallbacks = pVVar4;
  (this->env).maxResourceConsumers = 1;
  return;
}

Assistant:

EnvClone (const Environment& parent, const Device::Parameters& deviceParams, deUint32 maxResourceConsumers)
		: deviceRes	(parent, deviceParams)
		, device	(Device::create(parent, deviceRes, deviceParams))
		, vkd		(deviceRes.vki, *device)
		, env		(parent.vkp, vkd, *device, deviceRes.queueFamilyIndex, parent.programBinaries, parent.allocationCallbacks, maxResourceConsumers)
	{
	}